

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnemonic.c
# Opt level: O2

int mnemonic_to_bytes(words *w,char *mnemonic,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  words *w_00;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (len != 0 && (bytes_out != (uchar *)0x0 && w != (words *)0x0)) {
    w_00 = wordlist_init(mnemonic);
    if (w_00 == (words *)0x0) {
      iVar1 = -3;
    }
    else {
      uVar5 = w_00->len;
      if (w->bits * uVar5 + 7 >> 3 <= len) {
        wally_clear(bytes_out,len);
        for (uVar4 = 0; uVar5 = w_00->len, uVar4 < uVar5; uVar4 = uVar4 + 1) {
          sVar2 = wordlist_lookup_word(w,w_00->indices[uVar4]);
          if (sVar2 == 0) {
            wordlist_free(w_00);
            wally_clear(bytes_out,len);
            return -2;
          }
          sVar3 = w->bits;
          uVar5 = sVar3 * uVar4;
          for (; sVar3 != 0; sVar3 = sVar3 - 1) {
            if ((sVar2 + 0xffffffff >> ((ulong)((int)sVar3 - 1U & 0xff) & 0x3f) & 1) != 0) {
              bytes_out[uVar5 >> 3] = bytes_out[uVar5 >> 3] | '\x01' << (~(byte)uVar5 & 7);
            }
            uVar5 = uVar5 + 1;
          }
        }
      }
      if (written != (size_t *)0x0) {
        *written = uVar5 * w->bits + 7 >> 3;
      }
      wordlist_free(w_00);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mnemonic_to_bytes(const struct words *w, const char *mnemonic,
                      unsigned char *bytes_out, size_t len, size_t *written)
{
    struct words *mnemonic_w = NULL;
    size_t i;

    if (written)
        *written = 0;

    if (!w || !bytes_out || !len)
        return WALLY_EINVAL;

    mnemonic_w = wordlist_init(mnemonic);

    if (!mnemonic_w)
        return WALLY_ENOMEM;

    if ((mnemonic_w->len * w->bits + 7u) / 8u > len)
        goto cleanup; /* Return the length we would have written */

    wally_clear(bytes_out, len);

    for (i = 0; i < mnemonic_w->len; ++i) {
        size_t idx = wordlist_lookup_word(w, mnemonic_w->indices[i]);
        if (!idx) {
            wordlist_free(mnemonic_w);
            wally_clear(bytes_out, len);
            return WALLY_EINVAL;
        }
        store_index(w->bits, bytes_out, i, idx - 1);
    }

cleanup:
    if (written)
        *written = (mnemonic_w->len * w->bits + 7u) / 8u;
    wordlist_free(mnemonic_w);
    return WALLY_OK;
}